

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildService
          (DescriptorBuilder *this,ServiceDescriptorProto *proto,void *param_2,
          ServiceDescriptor *result,FlatAllocator *alloc)

{
  int iVar1;
  string *psVar2;
  PointerT<char> pcVar3;
  ushort *puVar4;
  undefined8 *puVar5;
  DescriptorNames DVar6;
  Nullable<const_char_*> failure_msg;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>_>
  *proto_00;
  long lVar7;
  int i;
  long lVar8;
  int iVar9;
  string_view scope;
  string_view name;
  string_view full_name;
  string_view proto_name;
  string_view full_name_00;
  string_view option_name;
  string_view name_00;
  LogMessageFatal local_40;
  
  psVar2 = this->file_->package_;
  puVar5 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  scope._M_str = (psVar2->_M_dataplus)._M_p;
  scope._M_len = psVar2->_M_string_length;
  proto_name._M_str = (char *)*puVar5;
  proto_name._M_len = puVar5[1];
  DVar6 = AllocateNameStrings(this,scope,proto_name,&proto->super_Message,alloc);
  (result->all_names_).payload_ = DVar6.payload_;
  result->file_ = this->file_;
  puVar5 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  full_name_00._M_len = (ulong)*(ushort *)(DVar6.payload_ + 2);
  full_name_00._M_str = DVar6.payload_ + ~full_name_00._M_len;
  name._M_str = (char *)*puVar5;
  name._M_len = puVar5[1];
  ValidateSymbolName(this,name,full_name_00,&proto->super_Message);
  iVar9 = *(int *)((long)&proto->field_0 + 0x10);
  result->method_count_ = iVar9;
  pcVar3 = (alloc->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value;
  if (pcVar3 == (PointerT<char>)0x0) {
    failure_msg = "has_allocated()";
    iVar9 = 0x1b0;
  }
  else {
    iVar1 = (alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).used_.payload_.super_Base<char>.value;
    iVar9 = iVar9 * 0x50 + iVar1;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<char>.value = iVar9;
    failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                            (iVar9,(alloc->
                                   super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                   ).total_.payload_.super_Base<char>.value,
                             "used <= total_.template Get<TypeToUse>()");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      result->methods_ = (MethodDescriptor *)(pcVar3 + iVar1);
      lVar7 = 0;
      for (lVar8 = 0; lVar8 < *(int *)((long)&proto->field_0 + 0x10); lVar8 = lVar8 + 1) {
        proto_00 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                             (&(proto->field_0)._impl_.method_.super_RepeatedPtrFieldBase,(int)lVar8
                             );
        BuildMethod(this,proto_00,result,
                    (MethodDescriptor *)(&result->methods_->super_SymbolBase + lVar7),alloc);
        lVar7 = lVar7 + 0x50;
      }
      option_name._M_str = "google.protobuf.ServiceOptions";
      option_name._M_len = 0x1e;
      AllocateOptions<google::protobuf::ServiceDescriptor>(this,proto,result,3,option_name,alloc);
      puVar4 = (ushort *)(result->all_names_).payload_;
      full_name._M_len = (ulong)puVar4[1];
      full_name._M_str = (char *)((long)puVar4 + ~full_name._M_len);
      name_00._M_len = (ulong)*puVar4;
      name_00._M_str = (char *)((long)puVar4 + ~name_00._M_len);
      (result->super_SymbolBase).symbol_type_ = '\a';
      AddSymbol(this,full_name,(void *)0x0,name_00,&proto->super_Message,(Symbol)result);
      return;
    }
    iVar9 = 0x1b6;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,iVar9,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
}

Assistant:

void DescriptorBuilder::BuildService(const ServiceDescriptorProto& proto,
                                     const void* /* dummy */,
                                     ServiceDescriptor* result,
                                     internal::FlatAllocator& alloc) {
  result->all_names_ =
      AllocateNameStrings(file_->package(), proto.name(), proto, alloc);
  result->file_ = file_;
  ValidateSymbolName(proto.name(), result->full_name(), proto);

  BUILD_ARRAY(proto, result, method, BuildMethod, result);

  // Copy options.
  AllocateOptions(proto, result, ServiceDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.ServiceOptions", alloc);

  AddSymbol(result->full_name(), nullptr, result->name(), proto,
            Symbol(result));
}